

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O2

void __thiscall sf2cute::SFInstrument::AddZone(SFInstrument *this,SFInstrumentZone *zone)

{
  SoundFont *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  SFInstrument *pSVar2;
  invalid_argument *this_01;
  pointer *__ptr;
  undefined1 local_38 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (zone->parent_instrument_ == (SFInstrument *)0x0) {
    SFInstrumentZone::set_parent_instrument(zone,this);
    this_00 = this->parent_file_;
    if (((this_00 != (SoundFont *)0x0) &&
        (p_Var1 = (zone->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi, p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
       && (p_Var1->_M_use_count != 0)) {
      std::__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8),
                 &zone->sample_);
      SoundFont::AddSample(this_00,(shared_ptr<sf2cute::SFSample> *)(local_38 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
    }
    std::make_unique<sf2cute::SFInstrumentZone,sf2cute::SFInstrumentZone>
              ((SFInstrumentZone *)local_38);
    std::
    vector<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>,std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>>
    ::
    emplace_back<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>
              ((vector<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>,std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>>
                *)&this->zones_,
               (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                *)local_38);
    if ((SFInstrumentZone *)local_38._0_8_ != (SFInstrumentZone *)0x0) {
      (**(code **)(*(_func_int **)local_38._0_8_ + 8))();
    }
  }
  else {
    pSVar2 = SFInstrumentZone::parent_instrument(zone);
    if (pSVar2 != this) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_01,"Instrument zone has already been owned by another instrument.");
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return;
}

Assistant:

void SFInstrument::AddZone(SFInstrumentZone zone) {
  // Check the parent instrument of the zone.
  if (zone.has_parent_instrument()) {
    if (&zone.parent_instrument() == this) {
      // If the zone is already be owned by this instrument, do nothing.
      return;
    }
    else {
      // Otherwise raise an error. A zone cannot be shared by two parents.
      throw std::invalid_argument("Instrument zone has already been owned by another instrument.");
    }
  }

  // Set this instrument to the parent instrument of the zone.
  zone.set_parent_instrument(*this);

  // If the zone has an orphan sample, add it to the parent file.
  if (has_parent_file()) {
    if (zone.has_sample()) {
      parent_file().AddSample(zone.sample());
    }
  }

  // Add the zone to the list.
  zones_.push_back(std::make_unique<SFInstrumentZone>(std::move(zone)));
}